

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **aData,sqlite_int64 *pRowid)

{
  sqlite3_stmt *pStmt;
  int iVar1;
  RtreeCoord RVar2;
  sqlite3_int64 sVar3;
  RtreeValue RVar4;
  int local_9c;
  int jj;
  sqlite3_stmt *pUp;
  RtreeNode *pRStack_88;
  int rc2;
  RtreeNode *pLeaf;
  int steprc;
  int nn;
  int ii;
  int bHaveRowid;
  RtreeCell cell;
  int rc;
  Rtree *pRtree;
  sqlite_int64 *pRowid_local;
  sqlite3_value **aData_local;
  int nData_local;
  sqlite3_vtab *pVtab_local;
  
  cell.aCoord[9].f = 0.0;
  nn = 0;
  if (*(int *)&pVtab[3].field_0xc != 0) {
    return 0x206;
  }
  rtreeReference((Rtree *)pVtab);
  _ii = 0;
  if (1 < nData) {
    pLeaf._4_4_ = nData - 4;
    if ((int)(uint)(byte)pVtab[1].field_0xd < (int)pLeaf._4_4_) {
      pLeaf._4_4_ = (uint)(byte)pVtab[1].field_0xd;
    }
    if (pVtab[1].field_0xe == '\0') {
      for (steprc = 0; steprc < (int)pLeaf._4_4_; steprc = steprc + 2) {
        RVar4 = rtreeValueDown(aData[steprc + 3]);
        cell.aCoord[(long)steprc + -2].f = RVar4;
        RVar4 = rtreeValueUp(aData[steprc + 4]);
        cell.aCoord[(long)(steprc + 1) + -2].f = RVar4;
        if (cell.aCoord[(long)(steprc + 1) + -2].f <= cell.aCoord[(long)steprc + -2].f &&
            cell.aCoord[(long)steprc + -2].f != cell.aCoord[(long)(steprc + 1) + -2].f) {
          cell.aCoord[9].i = rtreeConstraintError((Rtree *)pVtab,steprc + 1);
          goto LAB_00211153;
        }
      }
    }
    else {
      for (steprc = 0; steprc < (int)pLeaf._4_4_; steprc = steprc + 2) {
        iVar1 = sqlite3_value_int(aData[steprc + 3]);
        cell.aCoord[(long)steprc + -2].i = iVar1;
        iVar1 = sqlite3_value_int(aData[steprc + 4]);
        cell.aCoord[(long)(steprc + 1) + -2].i = iVar1;
        if (cell.aCoord[(long)(steprc + 1) + -2].i < cell.aCoord[(long)steprc + -2].i) {
          cell.aCoord[9].i = rtreeConstraintError((Rtree *)pVtab,steprc + 1);
          goto LAB_00211153;
        }
      }
    }
    iVar1 = sqlite3_value_type(aData[2]);
    if (iVar1 != 5) {
      _ii = sqlite3_value_int64(aData[2]);
      iVar1 = sqlite3_value_type(*aData);
      if ((iVar1 == 5) || (sVar3 = sqlite3_value_int64(*aData), sVar3 != _ii)) {
        sqlite3_bind_int64((sqlite3_stmt *)pVtab[5].zErrMsg,1,_ii);
        pLeaf._0_4_ = sqlite3_step((sqlite3_stmt *)pVtab[5].zErrMsg);
        cell.aCoord[9].i = sqlite3_reset((sqlite3_stmt *)pVtab[5].zErrMsg);
        if ((int)pLeaf == 100) {
          iVar1 = sqlite3_vtab_on_conflict((sqlite3 *)pVtab[1].pModule);
          if (iVar1 != 5) {
            cell.aCoord[9].i = rtreeConstraintError((Rtree *)pVtab,0);
            goto LAB_00211153;
          }
          cell.aCoord[9].i = rtreeDeleteRowid((Rtree *)pVtab,_ii);
        }
      }
      nn = 1;
    }
  }
  iVar1 = sqlite3_value_type(*aData);
  if (iVar1 != 5) {
    sVar3 = sqlite3_value_int64(*aData);
    cell.aCoord[9].i = rtreeDeleteRowid((Rtree *)pVtab,sVar3);
  }
  if ((cell.aCoord[9].i == 0) && (1 < nData)) {
    pRStack_88 = (RtreeNode *)0x0;
    if (nn == 0) {
      cell.aCoord[9].i = rtreeNewRowid((Rtree *)pVtab,(i64 *)&ii);
    }
    *pRowid = _ii;
    if (cell.aCoord[9].i == 0) {
      cell.aCoord[9].i = ChooseLeaf((Rtree *)pVtab,(RtreeCell *)&ii,0,&stack0xffffffffffffff78);
    }
    if (cell.aCoord[9].i == 0) {
      pVtab[4].nRef = -1;
      cell.aCoord[9].i = rtreeInsertCell((Rtree *)pVtab,pRStack_88,(RtreeCell *)&ii,0);
      RVar2.i = nodeRelease((Rtree *)pVtab,pRStack_88);
      if (cell.aCoord[9].i == 0) {
        cell.aCoord[9].i = RVar2.i;
      }
    }
    if ((cell.aCoord[9].i == 0) && (*(char *)((long)&pVtab[1].zErrMsg + 1) != '\0')) {
      pStmt = (sqlite3_stmt *)pVtab[7].zErrMsg;
      sqlite3_bind_int64(pStmt,1,*pRowid);
      for (local_9c = 0; local_9c < (int)(uint)*(byte *)((long)&pVtab[1].zErrMsg + 1);
          local_9c = local_9c + 1) {
        sqlite3_bind_value(pStmt,local_9c + 2,aData[(int)((byte)pVtab[1].field_0xd + 3 + local_9c)])
        ;
      }
      sqlite3_step(pStmt);
      cell.aCoord[9].i = sqlite3_reset(pStmt);
    }
  }
LAB_00211153:
  rtreeRelease((Rtree *)pVtab);
  return cell.aCoord[9].i;
}

Assistant:

static int rtreeUpdate(
  sqlite3_vtab *pVtab, 
  int nData, 
  sqlite3_value **aData, 
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  int bHaveRowid = 0;             /* Set to 1 after new rowid is determined */

  if( pRtree->nNodeRef ){
    /* Unable to write to the btree while another cursor is reading from it,
    ** since the write might do a rebalance which would disrupt the read
    ** cursor. */
    return SQLITE_LOCKED_VTAB;
  }
  rtreeReference(pRtree);
  assert(nData>=1);

  cell.iRowid = 0;  /* Used only to suppress a compiler warning */

  /* Constraint handling. A write operation on an r-tree table may return
  ** SQLITE_CONSTRAINT for two reasons:
  **
  **   1. A duplicate rowid value, or
  **   2. The supplied data violates the "x2>=x1" constraint.
  **
  ** In the first case, if the conflict-handling mode is REPLACE, then
  ** the conflicting row can be removed before proceeding. In the second
  ** case, SQLITE_CONSTRAINT must be returned regardless of the
  ** conflict-handling mode specified by the user.
  */
  if( nData>1 ){
    int ii;
    int nn = nData - 4;

    if( nn > pRtree->nDim2 ) nn = pRtree->nDim2;
    /* Populate the cell.aCoord[] array. The first coordinate is aData[3].
    **
    ** NB: nData can only be less than nDim*2+3 if the rtree is mis-declared
    ** with "column" that are interpreted as table constraints.
    ** Example:  CREATE VIRTUAL TABLE bad USING rtree(x,y,CHECK(y>5));
    ** This problem was discovered after years of use, so we silently ignore
    ** these kinds of misdeclared tables to avoid breaking any legacy.
    */

#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].f = rtreeValueDown(aData[ii+3]);
        cell.aCoord[ii+1].f = rtreeValueUp(aData[ii+4]);
        if( cell.aCoord[ii].f>cell.aCoord[ii+1].f ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }else
#endif
    {
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].i = sqlite3_value_int(aData[ii+3]);
        cell.aCoord[ii+1].i = sqlite3_value_int(aData[ii+4]);
        if( cell.aCoord[ii].i>cell.aCoord[ii+1].i ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }

    /* If a rowid value was supplied, check if it is already present in 
    ** the table. If so, the constraint has failed. */
    if( sqlite3_value_type(aData[2])!=SQLITE_NULL ){
      cell.iRowid = sqlite3_value_int64(aData[2]);
      if( sqlite3_value_type(aData[0])==SQLITE_NULL
       || sqlite3_value_int64(aData[0])!=cell.iRowid
      ){
        int steprc;
        sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
        steprc = sqlite3_step(pRtree->pReadRowid);
        rc = sqlite3_reset(pRtree->pReadRowid);
        if( SQLITE_ROW==steprc ){
          if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
            rc = rtreeDeleteRowid(pRtree, cell.iRowid);
          }else{
            rc = rtreeConstraintError(pRtree, 0);
            goto constraint;
          }
        }
      }
      bHaveRowid = 1;
    }
  }

  /* If aData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( sqlite3_value_type(aData[0])!=SQLITE_NULL ){
    rc = rtreeDeleteRowid(pRtree, sqlite3_value_int64(aData[0]));
  }

  /* If the aData[] array contains more than one element, elements
  ** (aData[2]..aData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;

    /* Figure out the rowid of the new row. */
    if( bHaveRowid==0 ){
      rc = rtreeNewRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;

    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      pRtree->iReinsertHeight = -1;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
    if( rc==SQLITE_OK && pRtree->nAux ){
      sqlite3_stmt *pUp = pRtree->pWriteAux;
      int jj;
      sqlite3_bind_int64(pUp, 1, *pRowid);
      for(jj=0; jj<pRtree->nAux; jj++){
        sqlite3_bind_value(pUp, jj+2, aData[pRtree->nDim2+3+jj]);
      }
      sqlite3_step(pUp);
      rc = sqlite3_reset(pUp);
    }
  }

constraint:
  rtreeRelease(pRtree);
  return rc;
}